

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedTimeZone::findPrev
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,UDate *transitionTime,
          TimeZoneRule **fromRule,TimeZoneRule **toRule)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  TimeZoneRule *this_00;
  TimeZoneRule *this_01;
  TimeZoneRule *this_02;
  UDate start1;
  UDate start0;
  double local_68;
  double local_40;
  double local_38;
  
  if (this->fHistoricTransitions == (UVector *)0x0) {
    return '\0';
  }
  pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,0);
  local_68 = *pdVar8;
  if (inclusive == '\0') {
LAB_001edd71:
    if (base <= local_68) {
      return '\0';
    }
    iVar6 = this->fHistoricTransitions->count;
    pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar6 + -1);
    local_68 = *pdVar8;
    if (inclusive != '\0') {
      if ((local_68 == base) && (!NAN(local_68) && !NAN(base))) goto LAB_001eddad;
    }
    if (base <= local_68) {
      if (1 < iVar6) {
        iVar6 = iVar6 + -2;
        do {
          pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar6);
          local_68 = *pdVar8;
          if ((iVar6 < 1) || (local_68 < base)) break;
          iVar6 = iVar6 + -1;
        } while (inclusive == '\0' || base != local_68);
      }
    }
    else if (this->fFinalRules != (UVector *)0x0) {
      this_00 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
      this_01 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
      uVar4 = TimeZoneRule::getRawOffset(this_01);
      uVar5 = TimeZoneRule::getDSTSavings(this_01);
      iVar6 = (*(this_00->super_UObject)._vptr_UObject[10])
                        (base,this_00,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,
                         &local_38);
      uVar4 = TimeZoneRule::getRawOffset(this_00);
      uVar5 = TimeZoneRule::getDSTSavings(this_00);
      iVar7 = (*(this_01->super_UObject)._vptr_UObject[10])
                        (base,this_01,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,
                         &local_40);
      if ((char)iVar6 == '\0' && (char)iVar7 == '\0') {
        return '\0';
      }
      this_02 = this_00;
      local_68 = local_40;
      if (local_40 < local_38 || (char)iVar7 == '\0') {
        this_02 = this_01;
        this_01 = this_00;
        local_68 = local_38;
      }
      goto LAB_001eddb5;
    }
  }
  else if ((local_68 != base) || (NAN(local_68) || NAN(base))) goto LAB_001edd71;
LAB_001eddad:
  this_02 = (TimeZoneRule *)pdVar8[1];
  this_01 = (TimeZoneRule *)pdVar8[2];
LAB_001eddb5:
  iVar2 = TimeZoneRule::getRawOffset(this_02);
  iVar3 = TimeZoneRule::getRawOffset(this_01);
  if (iVar2 == iVar3) {
    iVar2 = TimeZoneRule::getDSTSavings(this_02);
    iVar3 = TimeZoneRule::getDSTSavings(this_01);
    if (iVar2 == iVar3) {
      UVar1 = findPrev(this,local_68,'\0',transitionTime,fromRule,toRule);
      return UVar1;
    }
  }
  *transitionTime = local_68;
  *fromRule = this_02;
  *toRule = this_01;
  return '\x01';
}

Assistant:

UBool
RuleBasedTimeZone::findPrev(UDate base, UBool inclusive, UDate& transitionTime,
                            TimeZoneRule*& fromRule, TimeZoneRule*& toRule) const {
    if (fHistoricTransitions == NULL) {
        return FALSE;
    }
    UBool found = FALSE;
    Transition result;
    Transition *tzt = (Transition*)fHistoricTransitions->elementAt(0);
    UDate tt = tzt->time;
    if (inclusive && tt == base) {
        result = *tzt;
        found = TRUE;
    } else if (tt < base) {
        int32_t idx = fHistoricTransitions->size() - 1;        
        tzt = (Transition*)fHistoricTransitions->elementAt(idx);
        tt = tzt->time;
        if (inclusive && tt == base) {
            result = *tzt;
            found = TRUE;
        } else if (tt < base) {
            if (fFinalRules != NULL) {
                // Find a transion time with finalRules
                TimeZoneRule *r0 = (TimeZoneRule*)fFinalRules->elementAt(0);
                TimeZoneRule *r1 = (TimeZoneRule*)fFinalRules->elementAt(1);
                UDate start0, start1;
                UBool avail0 = r0->getPreviousStart(base, r1->getRawOffset(), r1->getDSTSavings(), inclusive, start0);
                UBool avail1 = r1->getPreviousStart(base, r0->getRawOffset(), r0->getDSTSavings(), inclusive, start1);
                //  avail0/avail1 should be always TRUE
                if (!avail0 && !avail1) {
                    return FALSE;
                }
                if (!avail1 || start0 > start1) {
                    result.time = start0;
                    result.from = r1;
                    result.to = r0;
                } else {
                    result.time = start1;
                    result.from = r0;
                    result.to = r1;
                }
            } else {
                result = *tzt;
            }
            found = TRUE;
        } else {
            // Find a transition within the historic transitions
            idx--;
            while (idx >= 0) {
                tzt = (Transition*)fHistoricTransitions->elementAt(idx);
                tt = tzt->time;
                if (tt < base || (inclusive && tt == base)) {
                    break;
                }
                idx--;
            }
            result = *tzt;
            found = TRUE;
        }
    }
    if (found) {
        // For now, this implementation ignore transitions with only zone name changes.
        if (result.from->getRawOffset() == result.to->getRawOffset()
            && result.from->getDSTSavings() == result.to->getDSTSavings()) {
            // No offset changes.  Try next one if not final
            return findPrev(result.time, FALSE /* always exclusive */,
                transitionTime, fromRule, toRule);
        }
        transitionTime = result.time;
        fromRule = result.from;
        toRule = result.to;
        return TRUE;
    }
    return FALSE;
}